

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

int __thiscall MT32Emu::Synth::open(Synth *this,char *__file,int __oflag,...)

{
  undefined2 uVar1;
  MemParams *pMVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  RendererType RVar5;
  Synth *extraout_RAX;
  ulong uVar6;
  Bit16s *pBVar7;
  Synth *extraout_RAX_00;
  Synth *extraout_RAX_01;
  Synth *extraout_RAX_02;
  Synth *extraout_RAX_03;
  PartialManager *this_00;
  PCMWaveEntry *pPVar8;
  PatchParam *pPVar9;
  char (*newSoundGroupNames) [9];
  Part *this_01;
  RhythmPart *this_02;
  MidiEventQueue *this_03;
  Analog *pAVar10;
  RendererImpl<short> *this_04;
  RendererImpl<float> *this_05;
  Synth *extraout_RAX_04;
  Display *this_06;
  Bit32u in_ECX;
  int iVar11;
  PatchTemp *pPVar12;
  AnalogOutputMode in_R8D;
  PatchTemp *patchTemp;
  int i_2;
  char (*writableSoundGroupNames) [9];
  bool oldReverbOverridden;
  Bit8u i_1;
  PatchParam *patch;
  Bit8u i;
  bool mt32CompatibleReverb;
  AnalogOutputMode analogOutputMode_local;
  Bit32u usePartialCount_local;
  ROMImage *pcmROMImage_local;
  ROMImage *controlROMImage_local;
  Synth *this_local;
  
  if ((this->opened & 1U) == 0) {
    this->partialCount = in_ECX;
    this->abortingPoly = (Poly *)0x0;
    this->extensions->abortingPartIx = 0;
    memset(this->mt32ram,0x3f,0x10dab);
    bVar4 = loadControlROM(this,(ROMImage *)__file);
    if (bVar4) {
      initMemoryRegions(this);
      iVar11 = 0x40000;
      if (this->controlROMMap->pcmCount == 0x100) {
        iVar11 = 0x80000;
      }
      this->pcmROMSize = (long)iVar11;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = this->pcmROMSize;
      uVar6 = SUB168(auVar3 * ZEXT816(2),0);
      if (SUB168(auVar3 * ZEXT816(2),8) != 0) {
        uVar6 = 0xffffffffffffffff;
      }
      pBVar7 = (Bit16s *)operator_new__(uVar6);
      this->pcmROMData = pBVar7;
      bVar4 = loadPCMROM(this,___oflag);
      if (bVar4) {
        initReverbModels(this,(*(ushort *)this->controlROMFeatures >> 10 & 1) != 0);
        bVar4 = initTimbres(this,this->controlROMMap->timbreAMap,this->controlROMMap->timbreAOffset,
                            0x40,0,(bool)(this->controlROMMap->timbreACompressed & 1));
        if (bVar4) {
          bVar4 = initTimbres(this,this->controlROMMap->timbreBMap,
                              this->controlROMMap->timbreBOffset,0x40,0x40,
                              (bool)(this->controlROMMap->timbreBCompressed & 1));
          if (bVar4) {
            bVar4 = initTimbres(this,this->controlROMMap->timbreRMap,0,
                                this->controlROMMap->timbreRCount,0xc0,true);
            if (bVar4) {
              if (this->controlROMMap->timbreRCount == 0x1e) {
                memcpy(this->mt32ram->timbres + 0xde,this->mt32ram->timbres + 0xc0,0x1e00);
                memset(this->mt32ram->timbres + 0xfc,0,0x400);
              }
              memset(this->mt32ram->timbres + 0x80,0,0x4000);
              this_00 = (PartialManager *)operator_new(0x40);
              PartialManager::PartialManager(this_00,this,this->parts);
              this->partialManager = this_00;
              auVar3 = ZEXT216(this->controlROMMap->pcmCount) * ZEXT816(0x18);
              uVar6 = auVar3._0_8_;
              if (auVar3._8_8_ != 0) {
                uVar6 = 0xffffffffffffffff;
              }
              pPVar8 = (PCMWaveEntry *)operator_new__(uVar6);
              this->pcmWaves = pPVar8;
              initPCMList(this,this->controlROMMap->pcmTable,this->controlROMMap->pcmCount);
              memcpy(this->mt32ram->rhythmTemp,
                     this->controlROMData + this->controlROMMap->rhythmSettings,
                     (long)(int)((uint)this->controlROMMap->rhythmSettingsCount << 2));
              for (patch._3_1_ = 0; patch._3_1_ < 0x80; patch._3_1_ = patch._3_1_ + 1) {
                pPVar9 = this->mt32ram->patches + patch._3_1_;
                pPVar9->timbreGroup = patch._3_1_ / 0x40;
                pPVar9->timbreNum = patch._3_1_ % 0x40;
                pPVar9->keyShift = '\x18';
                pPVar9->fineTune = '2';
                pPVar9->benderRange = '\f';
                pPVar9->assignMode = '\0';
                pPVar9->reverbSwitch = '\x01';
                pPVar9->dummy = '\0';
              }
              (this->mt32ram->system).masterTune = 'J';
              (this->mt32ram->system).reverbMode = '\0';
              (this->mt32ram->system).reverbTime = '\x05';
              (this->mt32ram->system).reverbLevel = '\x03';
              pMVar2 = this->mt32ram;
              uVar6 = (ulong)this->controlROMMap->reserveSettings;
              *(undefined8 *)(pMVar2->system).reserveSettings =
                   *(undefined8 *)(this->controlROMData + uVar6);
              (pMVar2->system).reserveSettings[8] = this->controlROMData[uVar6 + 8];
              for (writableSoundGroupNames._7_1_ = 0; writableSoundGroupNames._7_1_ < 9;
                  writableSoundGroupNames._7_1_ = writableSoundGroupNames._7_1_ + 1) {
                (this->mt32ram->system).chanAssign[writableSoundGroupNames._7_1_] =
                     writableSoundGroupNames._7_1_ + 1;
              }
              (this->mt32ram->system).masterVol = 'd';
              bVar4 = this->reverbOverridden;
              this->reverbOverridden = false;
              refreshSystem(this);
              resetMasterTunePitchDelta(this);
              this->reverbOverridden = (bool)(bVar4 & 1);
              auVar3 = ZEXT216(this->controlROMMap->soundGroupsCount) * ZEXT816(9);
              uVar6 = auVar3._0_8_;
              if (auVar3._8_8_ != 0) {
                uVar6 = 0xffffffffffffffff;
              }
              newSoundGroupNames = (char (*) [9])operator_new__(uVar6);
              this->soundGroupNames = newSoundGroupNames;
              initSoundGroups(this,newSoundGroupNames);
              for (patchTemp._4_4_ = 0; (int)patchTemp._4_4_ < 9;
                  patchTemp._4_4_ = patchTemp._4_4_ + 1) {
                pPVar12 = this->mt32ram->patchTemp + (int)patchTemp._4_4_;
                (pPVar12->patch).timbreGroup = '\0';
                (pPVar12->patch).timbreNum = '\0';
                (pPVar12->patch).keyShift = '\x18';
                (pPVar12->patch).fineTune = '2';
                (pPVar12->patch).benderRange = '\f';
                (pPVar12->patch).assignMode = '\0';
                (pPVar12->patch).reverbSwitch = '\x01';
                (pPVar12->patch).dummy = '\0';
                pPVar12->outputLevel = 'P';
                pPVar12->panpot =
                     this->controlROMData[(int)(this->controlROMMap->panSettings + patchTemp._4_4_)]
                ;
                memset(pPVar12->dummyv,0,6);
                pPVar12->dummyv[1] = '\x7f';
                if ((int)patchTemp._4_4_ < 8) {
                  this_01 = (Part *)operator_new(0x208);
                  Part::Part(this_01,this,patchTemp._4_4_);
                  this->parts[(int)patchTemp._4_4_] = this_01;
                  (*this->parts[(int)patchTemp._4_4_]->_vptr_Part[5])();
                }
                else {
                  this_02 = (RhythmPart *)operator_new(0x8c30);
                  RhythmPart::RhythmPart(this_02,this,patchTemp._4_4_);
                  this->parts[(int)patchTemp._4_4_] = (Part *)this_02;
                }
              }
              memcpy(this->mt32default,this->mt32ram,0x10dab);
              this_03 = (MidiEventQueue *)operator_new(0x20);
              MidiEventQueue::MidiEventQueue
                        (this_03,this->extensions->midiEventQueueSize,
                         this->extensions->midiEventQueueSysexStorageBufferSize);
              this->midiQueue = this_03;
              uVar1 = *(undefined2 *)this->controlROMFeatures;
              RVar5 = getSelectedRendererType(this);
              pAVar10 = Analog::createAnalog(in_R8D,(bool)((byte)((ushort)uVar1 >> 0xb) & 1),RVar5);
              this->analog = pAVar10;
              setOutputGain(this,this->outputGain);
              setReverbOutputGain(this,this->reverbOutputGain);
              RVar5 = getSelectedRendererType(this);
              if (RVar5 == RendererType_BIT16S) {
                this_04 = (RendererImpl<short> *)operator_new(0xc040);
                RendererImpl<short>::RendererImpl(this_04,this);
                this->renderer = (Renderer *)this_04;
              }
              else {
                if (RVar5 != RendererType_FLOAT) {
                  RVar5 = getSelectedRendererType(this);
                  printDebug(this,"Synth: Unknown renderer type %i\n",(ulong)RVar5);
                  dispose(this);
                  this_local._7_1_ = 0;
                  this = extraout_RAX_04;
                  goto LAB_0011bc98;
                }
                this_05 = (RendererImpl<float> *)operator_new(0x18040);
                RendererImpl<float>::RendererImpl(this_05,this);
                this->renderer = (Renderer *)this_05;
              }
              this_06 = (Display *)operator_new(0x70);
              Display::Display(this_06,this);
              this->extensions->display = this_06;
              this->extensions->oldMT32DisplayFeatures =
                   (*(ushort *)this->controlROMFeatures >> 9 & 1) != 0;
              this->opened = true;
              this->activated = false;
              this_local._7_1_ = 1;
            }
            else {
              dispose(this);
              this_local._7_1_ = 0;
              this = extraout_RAX_03;
            }
          }
          else {
            dispose(this);
            this_local._7_1_ = 0;
            this = extraout_RAX_02;
          }
        }
        else {
          dispose(this);
          this_local._7_1_ = 0;
          this = extraout_RAX_01;
        }
      }
      else {
        printDebug(this,"Init Error - Missing PCM ROM image");
        (*this->reportHandler->_vptr_ReportHandler[4])();
        dispose(this);
        this_local._7_1_ = 0;
        this = extraout_RAX_00;
      }
    }
    else {
      printDebug(this,"Init Error - Missing or invalid Control ROM image");
      (*this->reportHandler->_vptr_ReportHandler[3])();
      dispose(this);
      this_local._7_1_ = 0;
      this = extraout_RAX;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_0011bc98:
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool Synth::open(const ROMImage &controlROMImage, const ROMImage &pcmROMImage, Bit32u usePartialCount, AnalogOutputMode analogOutputMode) {
	if (opened) {
		return false;
	}
	partialCount = usePartialCount;
	abortingPoly = NULL;
	extensions.abortingPartIx = 0;

	// This is to help detect bugs
	memset(&mt32ram, '?', sizeof(mt32ram));

#if MT32EMU_MONITOR_INIT
	printDebug("Loading Control ROM");
#endif
	if (!loadControlROM(controlROMImage)) {
		printDebug("Init Error - Missing or invalid Control ROM image");
		reportHandler->onErrorControlROM();
		dispose();
		return false;
	}

	initMemoryRegions();

	// 512KB PCM ROM for MT-32, etc.
	// 1MB PCM ROM for CM-32L, LAPC-I, CM-64, CM-500
	// Note that the size below is given in samples (16-bit), not bytes
	pcmROMSize = controlROMMap->pcmCount == 256 ? 512 * 1024 : 256 * 1024;
	pcmROMData = new Bit16s[pcmROMSize];

#if MT32EMU_MONITOR_INIT
	printDebug("Loading PCM ROM");
#endif
	if (!loadPCMROM(pcmROMImage)) {
		printDebug("Init Error - Missing PCM ROM image");
		reportHandler->onErrorPCMROM();
		dispose();
		return false;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Reverb Models");
#endif
	bool mt32CompatibleReverb = controlROMFeatures->defaultReverbMT32Compatible;
#if MT32EMU_MONITOR_INIT
	printDebug("Using %s Compatible Reverb Models", mt32CompatibleReverb ? "MT-32" : "CM-32L");
#endif
	initReverbModels(mt32CompatibleReverb);

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank A");
#endif
	if (!initTimbres(controlROMMap->timbreAMap, controlROMMap->timbreAOffset, 0x40, 0, controlROMMap->timbreACompressed)) {
		dispose();
		return false;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank B");
#endif
	if (!initTimbres(controlROMMap->timbreBMap, controlROMMap->timbreBOffset, 0x40, 64, controlROMMap->timbreBCompressed)) {
		dispose();
		return false;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank R");
#endif
	if (!initTimbres(controlROMMap->timbreRMap, 0, controlROMMap->timbreRCount, 192, true)) {
		dispose();
		return false;
	}

	if (controlROMMap->timbreRCount == 30) {
		// We must initialise all 64 rhythm timbres to avoid undefined behaviour.
		// SEMI-CONFIRMED: Old-gen MT-32 units likely map timbres 30..59 to 0..29.
		// Attempts to play rhythm timbres 60..63 exhibit undefined behaviour.
		// We want to emulate the wrap around, so merely copy the entire set of standard
		// timbres once more. The last 4 dangerous timbres are zeroed out.
		memcpy(&mt32ram.timbres[222], &mt32ram.timbres[192], sizeof(*mt32ram.timbres) * 30);
		memset(&mt32ram.timbres[252], 0, sizeof(*mt32ram.timbres) * 4);
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Timbre Bank M");
#endif
	// CM-64 seems to initialise all bytes in this bank to 0.
	memset(&mt32ram.timbres[128], 0, sizeof(mt32ram.timbres[128]) * 64);

	partialManager = new PartialManager(this, parts);

	pcmWaves = new PCMWaveEntry[controlROMMap->pcmCount];

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising PCM List");
#endif
	initPCMList(controlROMMap->pcmTable, controlROMMap->pcmCount);

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Rhythm Temp");
#endif
	memcpy(mt32ram.rhythmTemp, &controlROMData[controlROMMap->rhythmSettings], controlROMMap->rhythmSettingsCount * 4);

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising Patches");
#endif
	for (Bit8u i = 0; i < 128; i++) {
		PatchParam *patch = &mt32ram.patches[i];
		patch->timbreGroup = i / 64;
		patch->timbreNum = i % 64;
		patch->keyShift = 24;
		patch->fineTune = 50;
		patch->benderRange = 12;
		patch->assignMode = 0;
		patch->reverbSwitch = 1;
		patch->dummy = 0;
	}

#if MT32EMU_MONITOR_INIT
	printDebug("Initialising System");
#endif
	// The MT-32 manual claims that "Standard pitch" is 442Hz.
	mt32ram.system.masterTune = 0x4A; // Confirmed on CM-64
	mt32ram.system.reverbMode = 0; // Confirmed
	mt32ram.system.reverbTime = 5; // Confirmed
	mt32ram.system.reverbLevel = 3; // Confirmed
	memcpy(mt32ram.system.reserveSettings, &controlROMData[controlROMMap->reserveSettings], 9); // Confirmed
	for (Bit8u i = 0; i < 9; i++) {
		// This is the default: {1, 2, 3, 4, 5, 6, 7, 8, 9}
		// An alternative configuration can be selected by holding "Master Volume"
		// and pressing "PART button 1" on the real MT-32's frontpanel.
		// The channel assignment is then {0, 1, 2, 3, 4, 5, 6, 7, 9}
		mt32ram.system.chanAssign[i] = i + 1;
	}
	mt32ram.system.masterVol = 100; // Confirmed

	bool oldReverbOverridden = reverbOverridden;
	reverbOverridden = false;
	refreshSystem();
	resetMasterTunePitchDelta();
	reverbOverridden = oldReverbOverridden;

	char(*writableSoundGroupNames)[9] = new char[controlROMMap->soundGroupsCount][9];
	soundGroupNames = writableSoundGroupNames;
	initSoundGroups(writableSoundGroupNames);

	for (int i = 0; i < 9; i++) {
		MemParams::PatchTemp *patchTemp = &mt32ram.patchTemp[i];

		// Note that except for the rhythm part, these patch fields will be set in setProgram() below anyway.
		patchTemp->patch.timbreGroup = 0;
		patchTemp->patch.timbreNum = 0;
		patchTemp->patch.keyShift = 24;
		patchTemp->patch.fineTune = 50;
		patchTemp->patch.benderRange = 12;
		patchTemp->patch.assignMode = 0;
		patchTemp->patch.reverbSwitch = 1;
		patchTemp->patch.dummy = 0;

		patchTemp->outputLevel = 80;
		patchTemp->panpot = controlROMData[controlROMMap->panSettings + i];
		memset(patchTemp->dummyv, 0, sizeof(patchTemp->dummyv));
		patchTemp->dummyv[1] = 127;

		if (i < 8) {
			parts[i] = new Part(this, i);
			parts[i]->setProgram(controlROMData[controlROMMap->programSettings + i]);
		} else {
			parts[i] = new RhythmPart(this, i);
		}
	}

	// For resetting mt32 mid-execution
	mt32default = mt32ram;

	midiQueue = new MidiEventQueue(extensions.midiEventQueueSize, extensions.midiEventQueueSysexStorageBufferSize);

	analog = Analog::createAnalog(analogOutputMode, controlROMFeatures->oldMT32AnalogLPF, getSelectedRendererType());
#if MT32EMU_MONITOR_INIT
	static const char *ANALOG_OUTPUT_MODES[] = { "Digital only", "Coarse", "Accurate", "Oversampled2x" };
	printDebug("Using Analog output mode %s", ANALOG_OUTPUT_MODES[analogOutputMode]);
#endif
	setOutputGain(outputGain);
	setReverbOutputGain(reverbOutputGain);

	switch (getSelectedRendererType()) {
		case RendererType_BIT16S:
			renderer = new RendererImpl<IntSample>(*this);
#if MT32EMU_MONITOR_INIT
			printDebug("Using integer 16-bit samples in renderer and wave generator");
#endif
			break;
		case RendererType_FLOAT:
			renderer = new RendererImpl<FloatSample>(*this);
#if MT32EMU_MONITOR_INIT
			printDebug("Using float 32-bit samples in renderer and wave generator");
#endif
			break;
		default:
			printDebug("Synth: Unknown renderer type %i\n", getSelectedRendererType());
			dispose();
			return false;
	}

	extensions.display = new Display(*this);
	extensions.oldMT32DisplayFeatures = controlROMFeatures->oldMT32DisplayFeatures;

	opened = true;
	activated = false;

#if MT32EMU_MONITOR_INIT
	printDebug("*** Initialisation complete ***");
#endif
	return true;
}